

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadDouble(ON_BinaryArchive *this,size_t count,double *p)

{
  undefined1 uVar1;
  bool bVar2;
  double *pdStack_30;
  uchar c;
  uchar *b;
  bool rc;
  double *p_local;
  size_t count_local;
  ON_BinaryArchive *this_local;
  
  bVar2 = ReadByte(this,count << 3,p);
  if ((bVar2) && (pdStack_30 = p, p_local = (double *)count, this->m_endian == big_endian)) {
    while (p_local != (double *)0x0) {
      uVar1 = *(undefined1 *)pdStack_30;
      *(undefined1 *)pdStack_30 = *(undefined1 *)((long)pdStack_30 + 7);
      *(undefined1 *)((long)pdStack_30 + 7) = uVar1;
      uVar1 = *(undefined1 *)((long)pdStack_30 + 1);
      *(undefined1 *)((long)pdStack_30 + 1) = *(undefined1 *)((long)pdStack_30 + 6);
      *(undefined1 *)((long)pdStack_30 + 6) = uVar1;
      uVar1 = *(undefined1 *)((long)pdStack_30 + 2);
      *(undefined1 *)((long)pdStack_30 + 2) = *(undefined1 *)((long)pdStack_30 + 5);
      *(undefined1 *)((long)pdStack_30 + 5) = uVar1;
      uVar1 = *(undefined1 *)((long)pdStack_30 + 3);
      *(undefined1 *)((long)pdStack_30 + 3) = *(undefined1 *)((long)pdStack_30 + 4);
      *(undefined1 *)((long)pdStack_30 + 4) = uVar1;
      pdStack_30 = pdStack_30 + 1;
      p_local = (double *)((long)p_local + -1);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::ReadDouble(  // Read an array of IEEE 64 bit doubles
		size_t count,       // number of unsigned chars to read
		double* p
		)
{
  bool rc = ReadByte( count<<3, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b=(unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[7]; b[7] = c;
			c = b[1]; b[1] = b[6]; b[6] = c;
			c = b[2]; b[2] = b[5]; b[5] = c;
			c = b[3]; b[3] = b[4]; b[4] = c;
			b += 8;
		}
  }
  return rc;
}